

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

void BIT_flushBits(BIT_CStream_t *bitC)

{
  uint uVar1;
  size_t *psVar2;
  size_t *psVar3;
  
  uVar1 = bitC->bitPos;
  if (0x3f < uVar1) {
    __assert_fail("bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                  ,0xe0,"void BIT_flushBits(BIT_CStream_t *)");
  }
  psVar3 = (size_t *)bitC->ptr;
  psVar2 = (size_t *)bitC->endPtr;
  if (psVar3 <= psVar2) {
    *psVar3 = bitC->bitContainer;
    psVar3 = (size_t *)((long)psVar3 + (ulong)(uVar1 >> 3));
    if (psVar2 < psVar3) {
      psVar3 = psVar2;
    }
    bitC->ptr = (char *)psVar3;
    bitC->bitPos = uVar1 & 7;
    bitC->bitContainer = bitC->bitContainer >> ((byte)uVar1 & 0x38);
    return;
  }
  __assert_fail("bitC->ptr <= bitC->endPtr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                ,0xe1,"void BIT_flushBits(BIT_CStream_t *)");
}

Assistant:

MEM_STATIC void BIT_flushBits(BIT_CStream_t* bitC)
{
    size_t const nbBytes = bitC->bitPos >> 3;
    assert(bitC->bitPos < sizeof(bitC->bitContainer) * 8);
    assert(bitC->ptr <= bitC->endPtr);
    MEM_writeLEST(bitC->ptr, bitC->bitContainer);
    bitC->ptr += nbBytes;
    if (bitC->ptr > bitC->endPtr) bitC->ptr = bitC->endPtr;
    bitC->bitPos &= 7;
    bitC->bitContainer >>= nbBytes*8;
}